

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

int __thiscall
AbstractModuleClient::processEventMsg
          (AbstractModuleClient *this,char *sender,char *event,TrodesMsg *msg)

{
  allocator local_5a;
  allocator local_59;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string((string *)local_38,sender,&local_59);
  std::__cxx11::string::string((string *)local_58,event,&local_5a);
  (*(this->super_MlmWrap)._vptr_MlmWrap[0x10])(this,local_38,local_58,msg);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processEventMsg(const char *sender, const char *event, TrodesMsg &msg) {
    int rc = 0;
//    std::cout << "got event msg with " << msg.numContents() << "frames\n";
    recv_event(sender, event, msg);
    return rc;
}